

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

int wally_confidential_addr_segwit_to_ec_public_key
              (char *address,char *confidential_addr_family,uchar *bytes_out,size_t len)

{
  int iVar1;
  int local_42c;
  size_t sStack_428;
  int ret;
  size_t written;
  uint8_t local_418 [4];
  int witver;
  uchar buf [1000];
  size_t len_local;
  uchar *bytes_out_local;
  char *confidential_addr_family_local;
  char *address_local;
  
  written._4_4_ = 0;
  sStack_428 = 0;
  local_42c = 0;
  if ((((address == (char *)0x0) || (bytes_out == (uchar *)0x0)) ||
      (confidential_addr_family == (char *)0x0)) || (len != 0x21)) {
    address_local._4_4_ = -2;
  }
  else {
    buf._992_8_ = len;
    iVar1 = blech32_addr_decode((int *)((long)&written + 4),local_418,&stack0xfffffffffffffbd8,
                                confidential_addr_family,address);
    if (iVar1 == 0) {
      local_42c = -2;
    }
    else if ((written._4_4_ == 0) && ((sStack_428 == 0x35 || (sStack_428 == 0x41)))) {
      memcpy(bytes_out,local_418,0x21);
    }
    else {
      local_42c = -2;
    }
    wally_clear(local_418,1000);
    address_local._4_4_ = local_42c;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_segwit_to_ec_public_key(
    const char *address,
    const char *confidential_addr_family,
    unsigned char *bytes_out,
    size_t len)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    int witver = 0;
    size_t written = 0;
    int ret = WALLY_OK;

    if (!address || !bytes_out || !confidential_addr_family || len != EC_PUBLIC_KEY_LEN)
        return WALLY_EINVAL;

    /* Only v0 witness programs are currently allowed */
    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (witver != 0 || (written != 53 && written != 65))
        ret = WALLY_EINVAL;
    else
        memcpy(bytes_out, buf, EC_PUBLIC_KEY_LEN);

    wally_clear(buf, sizeof(buf));
    return ret;
}